

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedate.c
# Opt level: O0

time_t curl_getdate(char *p,time_t *now)

{
  uint uVar1;
  char *pcStack_28;
  int rc;
  time_t parsed;
  time_t *now_local;
  char *p_local;
  
  pcStack_28 = (char *)0xffffffffffffffff;
  parsed = (time_t)now;
  now_local = (time_t *)p;
  uVar1 = parsedate(p,(time_t *)&stack0xffffffffffffffd8);
  if (uVar1 < 3) {
    p_local = pcStack_28;
  }
  else {
    p_local = (char *)0xffffffffffffffff;
  }
  return (time_t)p_local;
}

Assistant:

time_t curl_getdate(const char *p, const time_t *now)
{
  time_t parsed = -1;
  int rc = parsedate(p, &parsed);
  (void)now; /* legacy argument from the past that we ignore */

  switch(rc) {
  case PARSEDATE_OK:
  case PARSEDATE_LATER:
  case PARSEDATE_SOONER:
    return parsed;
  }
  /* everything else is fail */
  return -1;
}